

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDFace *f,ON_SubDFaceParameter fp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_SubDComponentId local_40;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_38;
  ON_2dPoint p;
  ON_SubDComponentId OStack_20;
  ON_SubDFaceCornerDex cdex;
  ON_SubDFace *f_local;
  ON_SubDComponentParameter *this_local;
  
  this->m_cid = ON_SubDComponentId::Unset;
  memset(&this->m_p0,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p0).v_active_e);
  memset(&this->m_p1,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p1).v_active_f);
  ON_SubDComponentId::ON_SubDComponentId(&stack0xffffffffffffffe0,f);
  bVar1 = Internal_Init(this,OStack_20);
  if ((bVar1) && (bVar1 = ON_SubDFaceParameter::IsSet(&fp), bVar1)) {
    p.y._4_4_ = ON_SubDFaceParameter::FaceCornerDex(&fp);
    bVar1 = ON_SubDFaceCornerDex::IsSet((ON_SubDFaceCornerDex *)((long)&p.y + 4));
    if (bVar1) {
      uVar2 = ON_SubDFaceCornerDex::EdgeCount((ON_SubDFaceCornerDex *)((long)&p.y + 4));
      uVar3 = ON_SubDFace::EdgeCount(f);
      if (uVar2 == uVar3) {
        _local_38 = ON_SubDFaceParameter::FaceCornerParameters(&fp);
        bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&local_38.v_active_e);
        if (bVar1) {
          uVar2 = ON_SubDFaceCornerDex::CornerIndex((ON_SubDFaceCornerDex *)((long)&p.y + 4));
          ON_SubDComponentId::ON_SubDComponentId(&local_40,f,uVar2);
          this->m_cid = local_40;
          this->m_p0 = local_38;
          (this->m_p1).f_corner_t = p.x;
        }
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDFace* f,
  ON_SubDFaceParameter fp
)
{
  if (Internal_Init(ON_SubDComponentId(f)) && fp.IsSet())
  {
    const ON_SubDFaceCornerDex cdex = fp.FaceCornerDex();
    if (cdex.IsSet() && cdex.EdgeCount() == f->EdgeCount())
    {
      const ON_2dPoint p = fp.FaceCornerParameters();
      if (p.IsValid())
      {
        this->m_cid = ON_SubDComponentId(f, cdex.CornerIndex());
        this->m_p0.f_corner_s = p.x;
        this->m_p1.f_corner_t = p.y;
      }
    }
  }
}